

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_clear_stale_list(filemgr *file)

{
  list_elem *__ptr;
  long in_RDI;
  stale_data *item;
  list_elem *e;
  list_elem *local_10;
  
  if (*(long *)(in_RDI + 0x280) != 0) {
    local_10 = list_begin(*(list **)(in_RDI + 0x280));
    while (local_10 != (list_elem *)0x0) {
      __ptr = local_10 + -1;
      local_10 = list_remove(*(list **)(in_RDI + 0x280),local_10);
      free(__ptr);
    }
    *(undefined8 *)(in_RDI + 0x280) = 0;
  }
  return;
}

Assistant:

void filemgr_clear_stale_list(struct filemgr *file)
{
    if (file->stale_list) {
        // if the items in the list are not freed yet, release them first.
        struct list_elem *e;
        struct stale_data *item;

        e = list_begin(file->stale_list);
        while (e) {
            item = _get_entry(e, struct stale_data, le);
            e = list_remove(file->stale_list, e);
            free(item);
        }
        file->stale_list = NULL;
    }
}